

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void duckdb::ParseParquetFooter
               (data_ptr_t buffer,string *file_path,idx_t file_size,
               shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *encryption_config,
               uint32_t *footer_len,bool *footer_encrypted)

{
  uint32_t uVar1;
  InvalidInputException *pIVar2;
  allocator local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (*(int *)(buffer + 4) == 0x31524150) {
    *footer_encrypted = false;
    if ((encryption_config->internal).
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_b8,
                 "File \'%s\' is not encrypted, but \'encryption_config\' was set",&local_b9);
      std::__cxx11::string::string((string *)&local_38,(string *)file_path);
      InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar2,&local_b8,&local_38)
      ;
      __cxa_throw(pIVar2,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (*(int *)(buffer + 4) != 0x45524150) {
      pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_b8,"No magic bytes found at end of file \'%s\'",&local_b9);
      std::__cxx11::string::string((string *)&local_78,(string *)file_path);
      InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar2,&local_b8,&local_78)
      ;
      __cxa_throw(pIVar2,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    *footer_encrypted = true;
    if ((encryption_config->internal).
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_b8,
                 "File \'%s\' is encrypted, but \'encryption_config\' was not set",&local_b9);
      std::__cxx11::string::string((string *)&local_58,(string *)file_path);
      InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar2,&local_b8,&local_58)
      ;
      __cxa_throw(pIVar2,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  uVar1 = *(uint32_t *)buffer;
  *footer_len = uVar1;
  if ((uVar1 != 0) && (uVar1 + 0xc <= file_size)) {
    return;
  }
  pIVar2 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_b8,"Footer length error in file \'%s\'",&local_b9);
  std::__cxx11::string::string((string *)&local_98,(string *)file_path);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar2,&local_b8,&local_98);
  __cxa_throw(pIVar2,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ParseParquetFooter(data_ptr_t buffer, const string &file_path, idx_t file_size,
                        const shared_ptr<const ParquetEncryptionConfig> &encryption_config, uint32_t &footer_len,
                        bool &footer_encrypted) {
	if (memcmp(buffer + 4, "PAR1", 4) == 0) {
		footer_encrypted = false;
		if (encryption_config) {
			throw InvalidInputException("File '%s' is not encrypted, but 'encryption_config' was set", file_path);
		}
	} else if (memcmp(buffer + 4, "PARE", 4) == 0) {
		footer_encrypted = true;
		if (!encryption_config) {
			throw InvalidInputException("File '%s' is encrypted, but 'encryption_config' was not set", file_path);
		}
	} else {
		throw InvalidInputException("No magic bytes found at end of file '%s'", file_path);
	}

	// read four-byte footer length from just before the end magic bytes
	footer_len = Load<uint32_t>(buffer);
	if (footer_len == 0 || file_size < 12 + footer_len) {
		throw InvalidInputException("Footer length error in file '%s'", file_path);
	}
}